

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void add_buffer_to_pending_queue(CManager_conflict cm,CMConnection conn,CMbuffer buf,long length)

{
  pending_queue_entry *ppVar1;
  int iVar2;
  pending_queue_entry *ppVar3;
  pending_queue *pppVar4;
  pending_queue ppVar5;
  
  iVar2 = CManager_locked(cm);
  if (iVar2 != 0) {
    ppVar3 = (pending_queue_entry *)INT_CMmalloc(0x20);
    ppVar3->next = (pending_queue_entry *)0x0;
    ppVar3->conn = conn;
    ppVar3->buffer = buf;
    ppVar3->length = length;
    ppVar1 = cm->pending_data_queue;
    if (cm->pending_data_queue == (pending_queue)0x0) {
      pppVar4 = &cm->pending_data_queue;
    }
    else {
      do {
        ppVar5 = ppVar1;
        ppVar1 = ppVar5->next;
      } while (ppVar1 != (pending_queue_entry *)0x0);
      pppVar4 = &ppVar5->next;
    }
    *pppVar4 = ppVar3;
    (*cm->control_list->wake_select)(&CMstatic_trans_svcs,&cm->control_list->select_data);
    return;
  }
  __assert_fail("CManager_locked(cm)",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                ,0x7c7,"void add_buffer_to_pending_queue(CManager, CMConnection, CMbuffer, long)");
}

Assistant:

static void add_buffer_to_pending_queue(CManager cm, CMConnection conn, CMbuffer buf, long length)
 {
     assert(CManager_locked(cm));
     pending_queue entry = malloc(sizeof(struct pending_queue_entry));
     entry->next = NULL;
     entry->conn = conn;
     entry->buffer = buf;
     entry->length = length;
     if (!cm->pending_data_queue) {
	 cm->pending_data_queue = entry;
     } else {
	 pending_queue last = cm->pending_data_queue;
	 pending_queue tmp = last->next;
	 while (tmp) {
	     last = tmp;
	     tmp = tmp->next;
	 }
	 last->next = entry;
     }
     CMwake_server_thread(cm);
 }